

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

Error efsw::Errors::Log::createLastError(Error err,string *log)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  switch(err) {
  case WatcherFailed:
    std::operator+(&local_50,"File system watcher failed ( ",log);
    std::operator+(&local_30,&local_50," )");
    break;
  case FileRemote:
    std::operator+(&local_50,"File is located in a remote file system, use a generic watcher. ( ",
                   log);
    std::operator+(&local_30,&local_50," )");
    break;
  default:
    std::__cxx11::string::_M_assign((string *)LastError_abi_cxx11_);
    return err;
  case FileOutOfScope:
    std::operator+(&local_50,"Symlink file out of scope ( ",log);
    std::operator+(&local_30,&local_50," )");
    break;
  case FileRepeated:
    std::operator+(&local_50,"File repeated in watches ( ",log);
    std::operator+(&local_30,&local_50," )");
    break;
  case FileNotFound:
    std::operator+(&local_50,"File not found ( ",log);
    std::operator+(&local_30,&local_50," )");
  }
  std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return err;
}

Assistant:

Error Log::createLastError( Error err, std::string log ) {
	switch ( err ) {
		case FileNotFound:
			LastError = "File not found ( " + log + " )";
			break;
		case FileRepeated:
			LastError = "File repeated in watches ( " + log + " )";
			break;
		case FileOutOfScope:
			LastError = "Symlink file out of scope ( " + log + " )";
			break;
		case FileRemote:
			LastError =
				"File is located in a remote file system, use a generic watcher. ( " + log + " )";
			break;
		case WatcherFailed:
			LastError = "File system watcher failed ( " + log + " )";
			break;
		case Unspecified:
		default:
			LastError = log;
	}

	efDEBUG( "%s\n", LastError.c_str() );
	return err;
}